

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ModportSimplePortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportSimplePortListSyntax,slang::syntax::ModportSimplePortListSyntax_const&>
          (BumpAllocator *this,ModportSimplePortListSyntax *args)

{
  ModportSimplePortListSyntax *pMVar1;
  ModportSimplePortListSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pMVar1 = (ModportSimplePortListSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ModportSimplePortListSyntax::ModportSimplePortListSyntax(in_RSI,pMVar1);
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }